

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitboard.cc
# Opt level: O0

void board::bitboard::print(uint64_t bb)

{
  int local_14;
  uint64_t uStack_10;
  int i;
  uint64_t bb_local;
  
  uStack_10 = bb;
  for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
    if (local_14 % 8 == 0) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    if ((uStack_10 & 1) == 0) {
      std::operator<<((ostream *)&std::cout,"-");
    }
    else {
      std::operator<<((ostream *)&std::cout,"X");
    }
    uStack_10 = uStack_10 >> 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void board::bitboard::print(uint64_t bb)
{
    for (int i = 0; i < 64; i++) {
        if (i % 8 == 0) {
            std::cout << std::endl;
        }
        if (bb & 1ULL) {
            std::cout << "X";
        }
        else {
            std::cout << "-";
        }
        bb = bb >> 1;
    }
    std::cout << std::endl;
}